

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O2

Tensor<3> * __thiscall
Omega_h::average_metric<3,4>
          (Tensor<3> *__return_storage_ptr__,Omega_h *this,Few<Omega_h::Matrix<3,_3>,_4> ms,
          bool has_degen)

{
  Int n;
  Int j;
  long lVar1;
  Int i;
  long lVar2;
  undefined8 *puVar3;
  Matrix<3,_3> *pMVar4;
  undefined8 *puVar5;
  double *pdVar6;
  byte bVar7;
  Few<Omega_h::Vector<3>,_3> in_stack_ffffffffffffff18;
  Int ngood;
  undefined4 uStack_8c;
  double dStack_88;
  double local_80;
  Matrix<3,_3> am;
  
  bVar7 = 0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      (&ngood + lVar2 * 2)[0] = 0;
      (&ngood + lVar2 * 2)[1] = 0;
    }
    am.super_Few<Omega_h::Vector<3>,_3>.array_[lVar1].super_Few<double,_3>.array_[2] = local_80;
    am.super_Few<Omega_h::Vector<3>,_3>.array_[lVar1].super_Few<double,_3>.array_[0] =
         (double)CONCAT44(uStack_8c,ngood);
    am.super_Few<Omega_h::Vector<3>,_3>.array_[lVar1].super_Few<double,_3>.array_[1] = dStack_88;
  }
  ngood = 0;
  for (lVar1 = 0; n = ngood, lVar1 != 0x120; lVar1 = lVar1 + 0x48) {
    puVar3 = (undefined8 *)
             ((long)ms.array_[0].super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                    array_ + lVar1);
    puVar5 = (undefined8 *)&stack0xffffffffffffff18;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    }
    average_metric_contrib<3>(&am,&ngood,(Tensor<3>)in_stack_ffffffffffffff18.array_,SUB81(this,0));
  }
  pMVar4 = &am;
  pdVar6 = (double *)&stack0xffffffffffffff18;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar6 = (pMVar4->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_[0];
    pMVar4 = (Matrix<3,_3> *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
  }
  average_metric_finish<3>
            (__return_storage_ptr__,(Tensor<3>)in_stack_ffffffffffffff18.array_,n,SUB81(this,0));
  return __return_storage_ptr__;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> average_metric(
    Few<Tensor<dim>, n> const ms, bool const has_degen) {
  auto am = zero_matrix<dim, dim>();
  Int ngood = 0;
  for (Int i = 0; i < n; ++i) {
    average_metric_contrib(am, ngood, ms[i], has_degen);
  }
  return average_metric_finish(am, ngood, has_degen);
}